

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TabBarQueueReorderFromMousePos
               (ImGuiTabBar *tab_bar,ImGuiTabItem *src_tab,ImVec2 mouse_pos)

{
  float fVar1;
  uint uVar2;
  ImGuiTabItem *pIVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar8 = mouse_pos.x;
  if (tab_bar->ReorderRequestTabId != 0) {
    __assert_fail("tab_bar->ReorderRequestTabId == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                  ,0x1d39,
                  "void ImGui::TabBarQueueReorderFromMousePos(ImGuiTabBar *, const ImGuiTabItem *, ImVec2)"
                 );
  }
  if ((tab_bar->Flags & 1) != 0) {
    fVar9 = 0.0;
    if ((src_tab->Flags & 0xc0U) == 0) {
      fVar9 = tab_bar->ScrollingTarget;
    }
    fVar9 = (tab_bar->BarRect).Min.x - fVar9;
    fVar10 = src_tab->Offset + fVar9;
    pIVar3 = (tab_bar->Tabs).Data;
    if ((src_tab < pIVar3) || (uVar2 = (tab_bar->Tabs).Size, pIVar3 + (int)uVar2 <= src_tab)) {
      __assert_fail("it >= Data && it < Data + Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                    ,0x6ac,
                    "int ImVector<ImGuiTabItem>::index_from_ptr(const T *) const [T = ImGuiTabItem]"
                   );
    }
    iVar5 = (int)((ulong)((long)src_tab - (long)pIVar3) >> 3);
    uVar7 = iVar5 * -0x33333333;
    if ((uVar2 != uVar7 && SBORROW4(uVar2,uVar7) == (int)(uVar2 + iVar5 * 0x33333333) < 0) &&
        -1 < (int)uVar7) {
      uVar6 = uVar7;
      do {
        if (((pIVar3[uVar6].Flags & 0x20U) == 0) &&
           (((pIVar3[uVar6].Flags ^ src_tab->Flags) & 0xc0U) == 0)) {
          fVar11 = pIVar3[uVar6].Offset + fVar9;
          fVar1 = (GImGui->Style).ItemInnerSpacing.x;
          uVar7 = uVar6;
          bVar4 = pIVar3[uVar6].Width + fVar11 + fVar1 <= fVar8;
          if (fVar8 < fVar10) {
            bVar4 = fVar8 <= fVar11 - fVar1;
          }
        }
        else {
          bVar4 = false;
        }
      } while (((bVar4) && (uVar6 = uVar6 + (uint)(fVar10 <= fVar8) * 2 + -1, -1 < (int)uVar6)) &&
              ((int)uVar6 < (int)uVar2));
    }
    iVar5 = uVar7 + iVar5 * 0x33333333;
    if (iVar5 != 0) {
      TabBarQueueReorder(tab_bar,src_tab,iVar5);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::TabBarQueueReorderFromMousePos(ImGuiTabBar* tab_bar, const ImGuiTabItem* src_tab, ImVec2 mouse_pos)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(tab_bar->ReorderRequestTabId == 0);
    if ((tab_bar->Flags & ImGuiTabBarFlags_Reorderable) == 0)
        return;

    const bool is_central_section = (src_tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    const float bar_offset = tab_bar->BarRect.Min.x - (is_central_section ? tab_bar->ScrollingTarget : 0);

    // Count number of contiguous tabs we are crossing over
    const int dir = (bar_offset + src_tab->Offset) > mouse_pos.x ? -1 : +1;
    const int src_idx = tab_bar->Tabs.index_from_ptr(src_tab);
    int dst_idx = src_idx;
    for (int i = src_idx; i >= 0 && i < tab_bar->Tabs.Size; i += dir)
    {
        // Reordered tabs must share the same section
        const ImGuiTabItem* dst_tab = &tab_bar->Tabs[i];
        if (dst_tab->Flags & ImGuiTabItemFlags_NoReorder)
            break;
        if ((dst_tab->Flags & ImGuiTabItemFlags_SectionMask_) != (src_tab->Flags & ImGuiTabItemFlags_SectionMask_))
            break;
        dst_idx = i;

        // Include spacing after tab, so when mouse cursor is between tabs we would not continue checking further tabs that are not hovered.
        const float x1 = bar_offset + dst_tab->Offset - g.Style.ItemInnerSpacing.x;
        const float x2 = bar_offset + dst_tab->Offset + dst_tab->Width + g.Style.ItemInnerSpacing.x;
        //GetForegroundDrawList()->AddRect(ImVec2(x1, tab_bar->BarRect.Min.y), ImVec2(x2, tab_bar->BarRect.Max.y), IM_COL32(255, 0, 0, 255));
        if ((dir < 0 && mouse_pos.x > x1) || (dir > 0 && mouse_pos.x < x2))
            break;
    }

    if (dst_idx != src_idx)
        TabBarQueueReorder(tab_bar, src_tab, dst_idx - src_idx);
}